

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qc_socket.c
# Opt level: O2

int qc_tcp_connect(QcSocket *socket,char *ip,int port)

{
  int iVar1;
  sockaddr_in addr;
  
  if (socket == (QcSocket *)0x0) {
    fprintf(_stderr,"stderr: assert throw. [%s  line:%d]\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_socket.c"
            ,0xbf);
    __assert_fail("socket",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_socket.c"
                  ,0xbf,"int qc_tcp_connect(QcSocket *, const char *, int)");
  }
  if (ip != (char *)0x0) {
    if (0 < port) {
      addr.sin_family = 2;
      addr.sin_port = (ushort)port << 8 | (ushort)port >> 8;
      addr.sin_addr.s_addr = inet_addr(ip);
      iVar1 = connect(socket->sockfd,(sockaddr *)&addr,0x10);
      if (iVar1 == 0) {
        iVar1 = 0;
      }
      else {
        _qc_perror("/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_socket.c"
                   ,0xc9,"tcp connect failed (ip=%s, port=%d)",ip,(ulong)(uint)port);
        iVar1 = -1;
      }
      return iVar1;
    }
    fprintf(_stderr,"stderr: assert throw. [%s  line:%d]\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_socket.c"
            ,0xc1);
    __assert_fail("port>0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_socket.c"
                  ,0xc1,"int qc_tcp_connect(QcSocket *, const char *, int)");
  }
  fprintf(_stderr,"stderr: assert throw. [%s  line:%d]\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_socket.c"
          ,0xc0);
  __assert_fail("ip",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_socket.c"
                ,0xc0,"int qc_tcp_connect(QcSocket *, const char *, int)");
}

Assistant:

int qc_tcp_connect(QcSocket *socket, const char* ip, int port)
{
    struct sockaddr_in addr;

    qc_assert(socket);
    qc_assert(ip);
    qc_assert(port>0);

    addr.sin_family = AF_INET;
    addr.sin_port = htons(port);
    addr.sin_addr.s_addr = inet_addr(ip);

    if(0 != connect(socket->sockfd, (struct sockaddr*)&addr, sizeof(addr)))
    {
        qc_perror("tcp connect failed (ip=%s, port=%d)", ip, port);
        return -1;
    }

    return 0;
}